

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void __thiscall FPolyObj::UpdateLinks(FPolyObj *this)

{
  FLinePortal *pFVar1;
  line_t *plVar2;
  vertex_t *pvVar3;
  DVector2 DVar4;
  DVector2 DVar5;
  double dVar6;
  double dVar7;
  FLinePortal *pFVar8;
  uint uVar9;
  uint uVar10;
  Node *pNVar11;
  Node *pNVar12;
  ulong uVar13;
  undefined4 uVar14;
  uint uVar15;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> local_70;
  double local_58;
  double dStack_50;
  DVector2 local_48;
  
  if (this->bHasPortals == '\x02') {
    local_70.NumUsed = 0;
    TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::SetNodeVector(&local_70,1);
    uVar10 = (this->Linedefs).Count;
    if (uVar10 != 0) {
      uVar13 = 0;
      do {
        uVar9 = linePortals.Count;
        pFVar8 = linePortals.Array;
        uVar15 = (this->Linedefs).Array[uVar13]->portalindex;
        if (((uVar15 < linePortals.Count) && ((linePortals.Array[uVar15].mFlags & 2) != 0)) &&
           (linePortals.Array[uVar15].mType == '\x03')) {
          pFVar1 = linePortals.Array + uVar15;
          local_58 = (pFVar1->mDisplacement).X;
          dStack_50 = (pFVar1->mDisplacement).Y;
          plVar2 = pFVar1->mDestination;
          pvVar3 = pFVar1->mOrigin->v1;
          dVar6 = (plVar2->v2->p).X - (pvVar3->p).X;
          dVar7 = (plVar2->v2->p).Y - (pvVar3->p).Y;
          uVar14 = SUB84(dVar7,0);
          uVar15 = (uint)((ulong)dVar7 >> 0x20);
          DVar4.Y._0_4_ = uVar14;
          DVar4.X = dVar6;
          DVar4.Y._4_4_ = uVar15;
          pFVar1->mDisplacement = DVar4;
          if (plVar2->portalindex < uVar9) {
            DVar5.Y._0_4_ = uVar14;
            DVar5.X = -dVar6;
            DVar5.Y._4_4_ = uVar15 ^ 0x80000000;
            pFVar8[plVar2->portalindex].mDisplacement = DVar5;
          }
          uVar15 = plVar2->frontsector->PortalGroup;
          pNVar11 = local_70.Nodes + (local_70.Size - 1 & uVar15);
          do {
            pNVar12 = pNVar11;
            if ((pNVar12 == (Node *)0x0) || (pNVar12->Next == (Node *)0x1)) goto LAB_0046f561;
            pNVar11 = pNVar12->Next;
          } while ((pNVar12->Pair).Key != uVar15);
          if ((pNVar12->Pair).Value == false) {
LAB_0046f561:
            pNVar11 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::GetNode
                                (&local_70,uVar15);
            (pNVar11->Pair).Value = true;
            dVar6 = (pFVar1->mDisplacement).Y - dStack_50;
            local_48.Y._0_4_ = SUB84(dVar6,0);
            local_48.X = (pFVar1->mDisplacement).X - local_58;
            local_48.Y._4_4_ = (int)((ulong)dVar6 >> 0x20);
            FDisplacementTable::MoveGroup(&Displacements,uVar15,&local_48);
            uVar10 = (this->Linedefs).Count;
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar10);
    }
    M_Free(local_70.Nodes);
  }
  return;
}

Assistant:

void FPolyObj::UpdateLinks()
{
	if (bHasPortals == 2)
	{
		TMap<int, bool> processed;
		for (unsigned i = 0; i < Linedefs.Size(); i++)
		{
			if (Linedefs[i]->isLinePortal())
			{
				FLinePortal *port = Linedefs[i]->getPortal();
				if (port->mType == PORTT_LINKED)
				{
					DVector2 old = port->mDisplacement;
					port->mDisplacement = port->mDestination->v2->fPos() - port->mOrigin->v1->fPos();
					FLinePortal *port2 = port->mDestination->getPortal();
					if (port2) port2->mDisplacement = -port->mDisplacement;
					int destgroup = port->mDestination->frontsector->PortalGroup;
					bool *done = processed.CheckKey(destgroup);
					if (!done || !*done)
					{
						processed[destgroup] = true;
						DVector2 delta = port->mDisplacement - old;
						Displacements.MoveGroup(destgroup, delta);
					}
				}
			}
		}
	}
}